

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

string * __thiscall
rapid::Request::user_agent_abi_cxx11_(string *__return_storage_ptr__,Request *this)

{
  _Head_base<0UL,_rapid::Request::Impl_*,_false> _Var1;
  mapped_type *pmVar2;
  allocator local_39;
  key_type local_38;
  
  _Var1._M_head_impl =
       (this->_impl)._M_t.
       super___uniq_ptr_impl<rapid::Request::Impl,_std::default_delete<rapid::Request::Impl>_>._M_t.
       super__Tuple_impl<0UL,_rapid::Request::Impl_*,_std::default_delete<rapid::Request::Impl>_>.
       super__Head_base<0UL,_rapid::Request::Impl_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&local_38,"USER_AGENT",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&(_Var1._M_head_impl)->_environments,&local_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Request::user_agent() const {
  try {
    return environments().at("USER_AGENT");
  } catch (std::out_of_range &e) {
    return "";
  }
}